

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O0

bool __thiscall WorkQueue<HTTPClosure>::Enqueue(WorkQueue<HTTPClosure> *this,HTTPClosure *item)

{
  long lVar1;
  size_type sVar2;
  deque<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
  *this_00;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock7;
  deque<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
  *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  char *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined1 local_21;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld((Mutex *)in_stack_ffffffffffffff88);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_RSI,(AnnotatedMixin<std::mutex> *)
                    CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,(int)((ulong)in_RDI >> 0x20),
             SUB81((ulong)in_RDI >> 0x18,0));
  if ((*(byte *)(in_RDI + 0xa8) & 1) != 0) {
    sVar2 = std::
            deque<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
            ::size(in_stack_ffffffffffffff88);
    if (sVar2 < *(ulong *)(in_RDI + 0xb0)) {
      this_00 = (deque<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>,_std::allocator<std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>_>_>
                 *)(in_RDI + 0x58);
      std::unique_ptr<HTTPClosure,std::default_delete<HTTPClosure>>::
      unique_ptr<std::default_delete<HTTPClosure>,void>
                ((unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_> *)
                 in_stack_ffffffffffffff88,(pointer)0xf53961);
      std::
      deque<std::unique_ptr<HTTPClosure,std::default_delete<HTTPClosure>>,std::allocator<std::unique_ptr<HTTPClosure,std::default_delete<HTTPClosure>>>>
      ::emplace_back<std::unique_ptr<HTTPClosure,std::default_delete<HTTPClosure>>>
                (this_00,(unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_> *)
                         CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
      std::unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_>::~unique_ptr
                ((unique_ptr<HTTPClosure,_std::default_delete<HTTPClosure>_> *)this_00);
      std::condition_variable::notify_one();
      local_21 = true;
      goto LAB_00f539c1;
    }
  }
  local_21 = false;
LAB_00f539c1:
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(!cs)
    {
        LOCK(cs);
        if (!running || queue.size() >= maxDepth) {
            return false;
        }
        queue.emplace_back(std::unique_ptr<WorkItem>(item));
        cond.notify_one();
        return true;
    }